

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall ot::commissioner::DtlsSession::Disconnect(DtlsSession *this,Error *aError)

{
  bool bVar1;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  bool local_181;
  undefined1 local_170 [15];
  v10 local_161;
  v10 *local_160;
  char *local_158;
  string local_150;
  allocator local_129;
  string local_128;
  Error local_f8;
  ErrorCode local_cc;
  Error *local_c8;
  Error *aError_local;
  DtlsSession *this_local;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  DtlsSession **local_38;
  undefined1 *local_30;
  DtlsSession **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  DtlsSession **local_10;
  
  if ((this->mState == kConnecting) || (this->mState == kConnected)) {
    local_181 = false;
    local_c8 = aError;
    aError_local = (Error *)this;
    if (this->mState == kConnected) {
      local_cc = kCancelled;
      local_181 = commissioner::operator==(aError,&local_cc);
    }
    if (local_181 != false) {
      mbedtls_ssl_close_notify(&this->mSsl);
    }
    this->mState = kDisconnected;
    bVar1 = std::operator!=(&this->mOnConnected,(nullptr_t)0x0);
    if (bVar1) {
      Error::Error(&local_f8,aError);
      std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
                (&this->mOnConnected,this,&local_f8);
      Error::~Error(&local_f8);
      std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator=
                (&this->mOnConnected,(nullptr_t)0x0);
    }
    Reset(this);
    std::allocator<char>::allocator();
    this_00 = (v10 *)0x33e30a;
    std::__cxx11::string::string((string *)&local_128,"dtls",&local_129);
    Disconnect::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)(local_170 + 0xe));
    local_58 = &local_160;
    local_60 = &local_161;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_158 = (char *)bVar2.size_;
    local_160 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<void_*,_FMT_COMPILE_STRING,_0>();
    local_68 = &local_150;
    local_78 = local_160;
    pcStack_70 = local_158;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *
               )local_170;
    local_50 = &local_78;
    local_90 = local_160;
    local_88 = local_158;
    local_170._0_8_ = this;
    local_48 = local_90;
    pcStack_40 = local_88;
    this_local = (DtlsSession *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*>
                           (local_80,this_00,(void **)local_68);
    local_30 = local_a0;
    local_38 = &this_local;
    local_20 = 0xe;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0xe;
    fmt.data_ = local_88;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_150,local_90,fmt,args);
    Log(kDebug,&local_128,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  return;
}

Assistant:

void DtlsSession::Disconnect(Error aError)
{
    VerifyOrExit(mState == State::kConnecting || mState == State::kConnected);

    // Send close notify if the connected session is cancelled by user.
    if (mState == State::kConnected && aError == ErrorCode::kCancelled)
    {
        // We don't care if the notify has been successfully delivered.
        mbedtls_ssl_close_notify(&mSsl);
    }

    mState = State::kDisconnected;
    if (mOnConnected != nullptr)
    {
        mOnConnected(*this, aError);
        mOnConnected = nullptr;
    }

    // Reset to the initial state.
    Reset();

    LOG_DEBUG(LOG_REGION_DTLS, "session(={}) disconnected", static_cast<void *>(this));

exit:
    return;
}